

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O3

timestamp_t __thiscall LFPConsumer::getData(LFPConsumer *this,int16_t *data)

{
  pointer psVar1;
  pointer piVar2;
  pointer piVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  timestamp_t tVar7;
  
  psVar1 = (this->temp).super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  (*(this->super_HFSubConsumer).super_HighFreqSub._vptr_HighFreqSub[5])
            (this,psVar1,
             (long)(this->temp).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)psVar1);
  piVar2 = (this->args).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (this->args).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar3 != piVar2) {
    uVar6 = 0;
    lVar5 = 0;
    do {
      if ((long)piVar2[uVar6 + 1] == 0) {
        lVar4 = 0;
      }
      else {
        memmove(data + lVar5,
                (this->temp).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                super__Vector_impl_data._M_start + piVar2[uVar6],(long)piVar2[uVar6 + 1] * 2);
        piVar2 = (this->args).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar3 = (this->args).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        lVar4 = (long)piVar2[uVar6 + 1];
      }
      lVar5 = lVar5 + lVar4;
      uVar6 = uVar6 + 2;
    } while (uVar6 < (ulong)((long)piVar3 - (long)piVar2 >> 2));
  }
  tVar7._4_4_ = 0;
  tVar7.trodes_timestamp =
       *(uint *)(this->temp).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                super__Vector_impl_data._M_start;
  tVar7.system_timestamp = (this->super_HFSubConsumer).lasttimestamp;
  return tVar7;
}

Assistant:

timestamp_t LFPConsumer::getData(int16_t *data){
//    lfpPacket packet;
    readData(temp.data(), temp.size()*sizeof(int16_t));
    size_t pos = 0;
    for(size_t i = 0; i < args.indices.size(); i+=2){
        // memcpy(data+pos, temp.data()+args.indices[i], args.indices[i+1]*sizeof(int16_t));
        std::copy(temp.data()+args.indices[i], 
                  temp.data()+args.indices[i]+args.indices[i+1], 
                  data+pos);
        pos += args.indices[i+1];
    }
    return {*(uint32_t*)temp.data(), lastSysTimestamp()};
}